

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O0

int streamWrapper(void *ptr,mpt_message *msg)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_1aa;
  undefined1 local_1a9;
  long lStack_1a8;
  mpt_msgtype hdr;
  mpt_command *ans;
  undefined8 *puStack_198;
  int ret;
  mpt_metatype *ctx;
  byte local_188 [7];
  uint8_t i;
  uint8_t id [255];
  uint64_t mid;
  mpt_message tmp;
  mpt_connection *pmStack_58;
  uint8_t idlen;
  mpt_event ev;
  mpt_connection *con;
  mpt_reply_context *rc;
  mpt_reply_data *rd;
  _streamWrapper *wd;
  mpt_message *msg_local;
  void *ptr_local;
  
  rd = (mpt_reply_data *)ptr;
  wd = (_streamWrapper *)msg;
  msg_local = (mpt_message *)ptr;
  memset(&stack0xffffffffffffffa8,0,0x18);
  ev.id = *(uintptr_t *)rd;
  tmp.clen._7_1_ = *(byte *)(ev.id + 0xd);
  if (tmp.clen._7_1_ == 0) {
    if (rd[1] == (mpt_reply_data)0x0) {
      ptr_local._4_4_ = 0;
    }
    else {
      ev.reply = (mpt_reply_context *)wd;
      ptr_local._4_4_ = (*(code *)rd[1])(rd[2],&stack0xffffffffffffffa8);
    }
  }
  else {
    ev.reply = (mpt_reply_context *)&mid;
    mid = (uint64_t)wd->con;
    tmp.used = (size_t)wd->cmd;
    tmp.base = wd->arg;
    tmp.cont = (iovec *)wd[1].con;
    uVar2 = mpt_message_read(&mid,tmp.clen._7_1_,local_188);
    if (uVar2 < tmp.clen._7_1_) {
      mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,"%s: %s","dispatch failed",
              "message id incomplete");
      ptr_local._4_4_ = -2;
    }
    else if ((local_188[0] & 0x80) == 0) {
      puStack_198 = (undefined8 *)0x0;
      for (ctx._7_1_ = 0; ctx._7_1_ < tmp.clen._7_1_; ctx._7_1_ = ctx._7_1_ + 1) {
        if (local_188[ctx._7_1_] != 0) {
          puStack_198 = *(undefined8 **)(ev.id + 0x20);
          if (puStack_198 == (undefined8 *)0x0) {
            puStack_198 = (undefined8 *)mpt_reply_deferrable(tmp.clen._7_1_,replyConnection,ev.id);
            if (puStack_198 == (undefined8 *)0x0) {
              mpt_message_buf2id(local_188,tmp.clen._7_1_,id + 0xf8);
              mpt_log(0,"mpt::connection::dispatch<mpt::stream>",4,"%s: %s (%08lx)",
                      "dispatch incomplete","no context available",stack0xffffffffffffff78);
            }
            else {
              *(undefined8 **)(ev.id + 0x20) = puStack_198;
            }
          }
          break;
        }
      }
      con = (mpt_connection *)0x0;
      rc = (mpt_reply_context *)0x0;
      if (((puStack_198 != (undefined8 *)0x0) &&
          (iVar1 = (**(code **)*puStack_198)(puStack_198,8,&rc), -1 < iVar1)) &&
         (rc != (mpt_reply_context *)0x0)) {
        (**(code **)*puStack_198)(puStack_198,0x82,&con);
      }
      pmStack_58 = con;
      if ((con == (mpt_connection *)0x0) ||
         (iVar1 = mpt_reply_set(rc,tmp.clen._7_1_,local_188), -1 < iVar1)) {
        if (rd[1] == (mpt_reply_data)0x0) {
          if (con != (mpt_connection *)0x0) {
            (*(code *)((con->out).buf._buf)->_vptr)(con,0);
          }
          ptr_local._4_4_ = 0;
        }
        else {
          ptr_local._4_4_ = (*(code *)rd[1])(rd[2],&stack0xffffffffffffffa8);
          if ((con != (mpt_connection *)0x0) && (*(short *)((long)&rc->_vptr + 2) != 0)) {
            local_1aa = 1;
            local_1a9 = (undefined1)ptr_local._4_4_;
            tmp.used = (size_t)&local_1aa;
            mid = 2;
            tmp.base = (void *)0x0;
            tmp.cont = (iovec *)0x0;
            (*(code *)((con->out).buf._buf)->_vptr)(con,&mid);
          }
        }
      }
      else {
        mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,"%s: %s","dispatch failed",
                "context not ready");
        ptr_local._4_4_ = -4;
      }
    }
    else {
      local_188[0] = local_188[0] & 0x7f;
      iVar1 = mpt_message_buf2id(local_188,tmp.clen._7_1_,id + 0xf8);
      if ((iVar1 < 0) || (8 < iVar1)) {
        mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,"%s: %s","dispatch failed",
                "reply id invalid");
      }
      lStack_1a8 = mpt_command_get(ev.id + 0x18,stack0xffffffffffffff78);
      if (lStack_1a8 == 0) {
        mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,"%s: %s (%08lx)","dispatch failed",
                "unknown reply id",stack0xffffffffffffff78);
        ptr_local._4_4_ = -2;
      }
      else {
        ptr_local._4_4_ = (**(code **)(lStack_1a8 + 8))(*(undefined8 *)(lStack_1a8 + 0x10),&mid);
      }
    }
  }
  return ptr_local._4_4_;
}

Assistant:

int streamWrapper(void *ptr, const MPT_STRUCT(message) *msg)
{
	const struct _streamWrapper *wd = ptr;
	MPT_STRUCT(reply_data) *rd;
	MPT_STRUCT(reply_context) *rc;
	MPT_STRUCT(connection) *con;
	MPT_STRUCT(event) ev = MPT_EVENT_INIT;
	uint8_t idlen;
	
	con = wd->con;
	
	/* default to one-way processing */
	if (!(idlen = con->out._idlen)) {
		if (!wd->cmd) {
			return 0;
		}
		ev.msg = msg;
		return wd->cmd(wd->arg, &ev);
	}
	else {
		static const char _func[] = "mpt::connection::dispatch<mpt::stream>";
		MPT_STRUCT(message) tmp;
		uint64_t mid;
		uint8_t id[UINT8_MAX], i;
		MPT_STRUCT(metatype) *ctx;
		int ret;
		
		/* consume message ID */
		ev.msg = &tmp;
		tmp = *msg;
		if ((mpt_message_read(&tmp, idlen, id)) < idlen) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("message id incomplete"));
			return MPT_ERROR(BadValue);
		}
		/* test reply indicator */
		if (id[0] & 0x80) {
			MPT_STRUCT(command) *ans;
			
			id[0] &= 0x7f;
			if ((ret = mpt_message_buf2id(id, idlen, &mid)) < 0
			    || ret > (int) sizeof(ans->id)) {
				mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
				        MPT_tr("dispatch failed"), MPT_tr("reply id invalid"));
			}
			/* find reply handler */
			if (!(ans = mpt_command_get(&con->_wait, mid))) {
				mpt_log(0, _func, MPT_LOG(Error), "%s: %s (%08" PRIx64 ")",
				        MPT_tr("dispatch failed"), MPT_tr("unknown reply id"), mid);
				return MPT_ERROR(BadValue);
			}
			return ans->cmd(ans->arg, &tmp);
		}
		ctx = 0;
		for (i = 0; i < idlen; ++i) {
			/* skip zero elements */
			if (!id[i]) {
				continue;
			}
			/* reply context required */
			if ((ctx = con->_rctx)) {
				break;
			}
			if ((ctx = mpt_reply_deferrable(idlen, replyConnection, con))) {
				con->_rctx = ctx;
				break;
			}
			mpt_message_buf2id(id, idlen, &mid);
			mpt_log(0, _func, MPT_LOG(Warning), "%s: %s (%08" PRIx64 ")",
			        MPT_tr("dispatch incomplete"), MPT_tr("no context available"), mid);
			break;
		}
		/* get reply data and interface for reference */
		rc = 0;
		rd = 0;
		if (ctx
		    && MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyDataPtr), &rd) >= 0
		    && rd) {
			MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyPtr), &rc);
		}
		if ((ev.reply = rc) && mpt_reply_set(rd, idlen, id) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("context not ready"));
			return MPT_ERROR(BadOperation);
		}
		if (!wd->cmd) {
			if (rc) {
				rc->_vptr->reply(rc, 0);
			}
			return 0;
		}
		ret = wd->cmd(wd->arg, &ev);
		/* generic reply to failed command */
		if (rc && rd->len) {
			MPT_STRUCT(msgtype) hdr;
			hdr.cmd = MPT_MESGTYPE(Answer);
			hdr.arg = ret;
			tmp.base = &hdr;
			tmp.used = sizeof(hdr);
			tmp.cont = 0;
			tmp.clen = 0;
			rc->_vptr->reply(rc, &tmp);
		}
		return ret;
	}
}